

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O0

uint16_t basisu::etc_block::pack_delta3(int r,int g,int b)

{
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int local_c;
  int local_8;
  int local_4;
  
  if (in_EDI < -4 || 3 < in_EDI) {
    __assert_fail("(r >= cETC1ColorDeltaMin) && (r <= cETC1ColorDeltaMax)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.cpp"
                  ,0x1ca,"static uint16_t basisu::etc_block::pack_delta3(int, int, int)");
  }
  if (in_ESI < -4 || 3 < in_ESI) {
    __assert_fail("(g >= cETC1ColorDeltaMin) && (g <= cETC1ColorDeltaMax)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.cpp"
                  ,0x1cb,"static uint16_t basisu::etc_block::pack_delta3(int, int, int)");
  }
  if (in_EDX < -4 || 3 < in_EDX) {
    __assert_fail("(b >= cETC1ColorDeltaMin) && (b <= cETC1ColorDeltaMax)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.cpp"
                  ,0x1cc,"static uint16_t basisu::etc_block::pack_delta3(int, int, int)");
  }
  local_4 = in_EDI;
  if (in_EDI < 0) {
    local_4 = in_EDI + 8;
  }
  local_8 = in_ESI;
  if (in_ESI < 0) {
    local_8 = in_ESI + 8;
  }
  local_c = in_EDX;
  if (in_EDX < 0) {
    local_c = in_EDX + 8;
  }
  return (ushort)local_c | (ushort)(local_8 << 3) | (ushort)(local_4 << 6);
}

Assistant:

uint16_t etc_block::pack_delta3(int r, int g, int b)
	{
		assert((r >= cETC1ColorDeltaMin) && (r <= cETC1ColorDeltaMax));
		assert((g >= cETC1ColorDeltaMin) && (g <= cETC1ColorDeltaMax));
		assert((b >= cETC1ColorDeltaMin) && (b <= cETC1ColorDeltaMax));
		if (r < 0) r += 8;
		if (g < 0) g += 8;
		if (b < 0) b += 8;
		return static_cast<uint16_t>(b | (g << 3) | (r << 6));
	}